

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLString.cpp
# Opt level: O1

int xercesc_4_0::XMLString::lastIndexOf
              (XMLCh *toSearch,XMLCh ch,XMLSize_t fromIndex,MemoryManager *manager)

{
  short *psVar1;
  ulong uVar2;
  ArrayIndexOutOfBoundsException *this;
  ulong uVar3;
  
  uVar2 = 0;
  if (toSearch != (XMLCh *)0x0) {
    do {
      psVar1 = (short *)((long)toSearch + uVar2);
      uVar2 = uVar2 + 2;
    } while (*psVar1 != 0);
    uVar2 = ((long)uVar2 >> 1) - 1;
  }
  if (fromIndex < uVar2) {
    uVar2 = fromIndex * 2;
    do {
      uVar3 = uVar2;
      if ((XMLCh *)((long)toSearch + uVar3) < toSearch) {
        return -1;
      }
      uVar2 = uVar3 - 2;
    } while (*(XMLCh *)((long)toSearch + uVar3) != ch);
    return (int)(uVar3 >> 1);
  }
  this = (ArrayIndexOutOfBoundsException *)__cxa_allocate_exception(0x30);
  ArrayIndexOutOfBoundsException::ArrayIndexOutOfBoundsException
            (this,
             "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLString.cpp"
             ,0x553,Str_StartIndexPastEnd,manager);
  __cxa_throw(this,&ArrayIndexOutOfBoundsException::typeinfo,XMLException::~XMLException);
}

Assistant:

int XMLString::lastIndexOf( const   XMLCh* const    toSearch
                            , const XMLCh           ch
                            , const XMLSize_t       fromIndex
                            , MemoryManager* const  manager)
{
    const XMLSize_t len = stringLen(toSearch);
    if (fromIndex >= len) {
        ThrowXMLwithMemMgr(ArrayIndexOutOfBoundsException, XMLExcepts::Str_StartIndexPastEnd, manager);
    }

    const XMLCh* srcPtr = toSearch+fromIndex;
    while (srcPtr >= toSearch)
        if (ch == *srcPtr--)
            return (int)(srcPtr + 1 - toSearch);
    return -1;
}